

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
* __thiscall
spvtools::opt::LoopFusion::LocationToMemOps
          (map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           *__return_storage_ptr__,LoopFusion *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *mem_ops)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  IRContext *pIVar3;
  iterator __position;
  uint32_t uVar4;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_00;
  pointer ppIVar5;
  Instruction *this_01;
  DefUseManager *this_02;
  Instruction *instruction;
  Instruction *local_40;
  Instruction *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppIVar5 = (mem_ops->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (mem_ops->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar5 != ppIVar2) {
    do {
      local_38 = *ppIVar5;
      pIVar3 = this->context_;
      if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar3);
      }
      this_02 = (pIVar3->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      this_01 = local_38;
      while( true ) {
        uVar4 = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          uVar4 = (uint)this_01->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(this_01,uVar4);
        local_40 = analysis::DefUseManager::GetDef(this_02,uVar4);
        if (local_40->opcode_ != OpAccessChain) break;
        pIVar3 = this->context_;
        if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar3);
        }
        this_02 = (pIVar3->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        this_01 = local_40;
      }
      this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                std::
                map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
                ::operator[](__return_storage_ptr__,&local_40);
      __position._M_current = *(Instruction ***)(this_00 + 8);
      if (__position._M_current == *(Instruction ***)(this_00 + 0x10)) {
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        _M_realloc_insert<spvtools::opt::Instruction*const&>(this_00,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      ppIVar5 = ppIVar5 + 1;
    } while (ppIVar5 != ppIVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<Instruction*, std::vector<Instruction*>> LoopFusion::LocationToMemOps(
    const std::vector<Instruction*>& mem_ops) {
  std::map<Instruction*, std::vector<Instruction*>> location_map{};

  for (auto instruction : mem_ops) {
    auto access_location = context_->get_def_use_mgr()->GetDef(
        instruction->GetSingleWordInOperand(0));

    while (access_location->opcode() == spv::Op::OpAccessChain) {
      access_location = context_->get_def_use_mgr()->GetDef(
          access_location->GetSingleWordInOperand(0));
    }

    location_map[access_location].push_back(instruction);
  }

  return location_map;
}